

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.cpp
# Opt level: O3

uzoff_t __thiscall IZDeflate::deflate_fast(IZDeflate *this)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uzoff_t uVar6;
  uint uVar7;
  ulong uVar8;
  uch *puVar9;
  int iVar10;
  IPos cur_match;
  
  this->prev_length = 2;
  uVar4 = this->lookahead;
  if (uVar4 != 0) {
    cur_match = 0;
    do {
      uVar7 = this->strstart;
      if (2 < uVar4) {
        uVar3 = (this->ins_h & 0x3ff) << 5 ^ (uint)this->window[uVar7 + 2];
        this->ins_h = uVar3;
        cur_match = (IPos)this->head[uVar3];
        this->prev[uVar7 & 0x7fff] = this->head[uVar3];
        this->head[uVar3] = (Pos)uVar7;
      }
      if (uVar7 - cur_match < 0x7efb && cur_match != 0) {
        if (uVar4 < (uint)this->nice_match) {
          this->nice_match = uVar4;
        }
        uVar4 = longest_match(this,cur_match);
        uVar7 = this->strstart;
        uVar3 = this->lookahead;
        if (uVar4 < this->lookahead) {
          uVar3 = uVar4;
        }
        if (uVar3 < 3) goto LAB_00178929;
        iVar5 = ct_tally(this,uVar7 - this->match_start,uVar3 - 3);
        uVar4 = this->lookahead - uVar3;
        this->lookahead = uVar4;
        if (2 < uVar4 && uVar3 <= this->max_lazy_match) {
          iVar10 = uVar3 - 1;
          uVar8 = (ulong)this->ins_h;
          uVar7 = this->strstart + 1;
          do {
            this->strstart = uVar7;
            uVar3 = ((uint)uVar8 & 0x3ff) << 5 ^ (uint)this->window[uVar7 + 2];
            uVar8 = (ulong)uVar3;
            this->ins_h = uVar3;
            cur_match = (IPos)this->head[uVar8];
            this->prev[uVar7 & 0x7fff] = this->head[uVar8];
            this->head[uVar8] = (Pos)uVar7;
            uVar7 = uVar7 + 1;
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
          goto LAB_00178953;
        }
        uVar2 = this->strstart;
        uVar7 = uVar2 + uVar3;
        this->strstart = uVar7;
        bVar1 = this->window[uVar7];
        this->ins_h = (uint)bVar1;
        this->ins_h = (uint)this->window[uVar2 + uVar3 + 1] ^ (uint)bVar1 << 5;
      }
      else {
LAB_00178929:
        iVar5 = ct_tally(this,0,(uint)this->window[uVar7]);
        uVar4 = this->lookahead - 1;
        this->lookahead = uVar4;
        uVar7 = this->strstart + 1;
LAB_00178953:
        this->strstart = uVar7;
      }
      if (iVar5 != 0) {
        uVar8 = this->block_start;
        puVar9 = this->window + (uVar8 & 0xffffffff);
        if ((long)uVar8 < 0) {
          puVar9 = (uch *)0x0;
        }
        flush_block(this,(char *)puVar9,uVar7 - uVar8,0);
        uVar4 = this->lookahead;
        this->block_start = (ulong)this->strstart;
      }
      if (uVar4 < 0x106) {
        fill_window(this);
        uVar4 = this->lookahead;
      }
    } while (uVar4 != 0);
  }
  uVar8 = this->block_start;
  puVar9 = (uch *)0x0;
  if (-1 < (long)uVar8) {
    puVar9 = this->window + (uVar8 & 0xffffffff);
  }
  uVar6 = flush_block(this,(char *)puVar9,this->strstart - uVar8,1);
  return uVar6;
}

Assistant:

uzoff_t IZDeflate::deflate_fast()
{
    IPos hash_head = NIL;      /* head of the hash chain */
    int flush;                 /* set if current block must be flushed */
    unsigned match_length = 0; /* length of best match */

    prev_length = MIN_MATCH - 1;
    while (lookahead != 0) {
        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
#    ifndef DEFL_UNDETERM
        if (lookahead >= MIN_MATCH)
#    endif
            INSERT_STRING(strstart, hash_head);

        /* Find the longest match, discarding those <= prev_length.
         * At this point we have always match_length < MIN_MATCH
         */
        if (hash_head != NIL && strstart - hash_head <= MAX_DIST) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
#    ifndef HUFFMAN_ONLY
#        ifndef DEFL_UNDETERM
            /* Do not look for matches beyond the end of the input.
             * This is necessary to make deflate deterministic.
             */
            if ((unsigned)nice_match > lookahead) nice_match = (int)lookahead;
#        endif
            match_length = longest_match(hash_head);
            /* longest_match() sets match_start */
            if (match_length > lookahead) match_length = lookahead;
#    endif
        }
        if (match_length >= MIN_MATCH) {
            check_match(strstart, match_start, match_length);

            flush = ct_tally(strstart - match_start, match_length - MIN_MATCH);

            lookahead -= match_length;

            /* Insert new strings in the hash table only if the match length
             * is not too large. This saves time but degrades compression.
             */
            if (match_length <= max_insert_length
#    ifndef DEFL_UNDETERM
                && lookahead >= MIN_MATCH
#    endif
            ) {
                match_length--; /* string at strstart already in hash table */
                do {
                    strstart++;
                    INSERT_STRING(strstart, hash_head);
                    /* strstart never exceeds WSIZE-MAX_MATCH, so there are
                     * always MIN_MATCH bytes ahead.
                     */
#    ifdef DEFL_UNDETERM
                    /* If lookahead < MIN_MATCH these bytes are garbage,
                     * but it does not matter since the next lookahead bytes
                     * will be emitted as literals.
                     */
#    endif
                } while (--match_length != 0);
                strstart++;
            } else {
                strstart += match_length;
                match_length = 0;
                ins_h = window[strstart];
                UPDATE_HASH(ins_h, window[strstart + 1]);
#    if MIN_MATCH != 3
                Call UPDATE_HASH() MIN_MATCH - 3 more times
#    endif
            }
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr, "%c", window[strstart]));
            flush = ct_tally(0, window[strstart]);
            lookahead--;
            strstart++;
        }
        if (flush) FLUSH_BLOCK(0), block_start = strstart;

        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (lookahead < MIN_LOOKAHEAD) fill_window();
    }
    return FLUSH_BLOCK(1); /* eof */
}